

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  pointer pbVar3;
  pointer pbVar4;
  size_type sVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  ostream *poVar9;
  istream *piVar10;
  long lVar11;
  ulong uVar12;
  pointer program;
  str *input;
  int iVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  char *pcVar17;
  bool bVar18;
  int local_634;
  string ln;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pr;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  string local_568 [32];
  stringstream out;
  ostream local_538 [376];
  ifstream fs;
  int aiStack_3a0 [122];
  stringstream err;
  ostream local_1a8 [376];
  
  if (argc < 2) {
    pcVar17 = "tests.txt";
  }
  else {
    pcVar17 = argv[1];
  }
  std::ifstream::ifstream(&fs);
  pr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  in.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  in.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ln._M_dataplus._M_p = (pointer)&ln.field_2;
  ln._M_string_length = 0;
  ln.field_2._M_local_buf[0] = '\0';
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  std::ifstream::open((char *)&fs,(_Ios_Openmode)pcVar17);
  if (*(int *)((long)aiStack_3a0 + *(long *)(_fs + -0x18)) == 0) {
    iVar13 = 0;
    iVar16 = 0;
    iVar2 = 0;
LAB_001095c0:
    iVar14 = iVar13 + 2;
    do {
      iVar13 = iVar13 + 1;
      iVar7 = (int)(istream *)&fs;
      std::ios::exceptions((int)*(undefined8 *)(_fs + -0x18) + iVar7);
      piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)&fs,(string *)&ln);
      if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) {
        iVar16 = 0;
        std::operator<<((ostream *)&std::cout,"All tests succeeded\n");
        goto LAB_00109abf;
      }
      std::ios::exceptions((int)*(undefined8 *)(_fs + -0x18) + iVar7);
      if (1 < ln._M_string_length) {
        iVar7 = std::__cxx11::string::find(-0x30,(ulong)(uint)(int)*ln._M_dataplus._M_p);
        iVar8 = iVar7 + 1;
        if ((iVar8 != 0) && ((cVar1 = ln._M_dataplus._M_p[1], cVar1 == '=' || (cVar1 == '['))))
        goto LAB_00109662;
      }
      iVar14 = iVar14 + 1;
    } while( true );
  }
  poVar9 = std::operator<<((ostream *)&std::cerr,"Couldn\'t open the file: ");
  poVar9 = std::operator<<(poVar9,pcVar17);
  std::endl<char,std::char_traits<char>>(poVar9);
  iVar16 = 1;
LAB_00109abf:
  std::__cxx11::string::~string((string *)&str);
  std::__cxx11::string::~string((string *)&ln);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&in);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&pr);
  std::ifstream::~ifstream(&fs);
  return iVar16;
LAB_00109662:
  if ((2 < iVar8) &&
     ((pr.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish ==
       pr.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ||
      (in.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish ==
       in.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)))) {
LAB_00109b0b:
    poVar9 = std::operator<<((ostream *)&std::cerr,"Bad test file format at line ");
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,iVar13);
    std::endl<char,std::char_traits<char>>(poVar9);
    goto LAB_00109b58;
  }
  if (cVar1 == '[') {
    lVar11 = std::__cxx11::string::find_first_not_of((char)&ln,0x5b);
    if (lVar11 != -1) goto LAB_00109b0b;
    str._M_string_length = 0;
    uVar15 = ln._M_string_length - 1;
    *str._M_dataplus._M_p = '\0';
    bVar18 = true;
    iVar13 = iVar14;
    while( true ) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&fs,(string *)&ln);
      uVar12 = std::__cxx11::string::find_first_not_of((char)&ln,0x5d);
      if (uVar15 <= ln._M_string_length && uVar15 <= uVar12) break;
      if (!bVar18) {
        std::__cxx11::string::append((char *)&str);
      }
      iVar13 = iVar13 + 1;
      bVar18 = false;
      std::__cxx11::string::append((string *)&str);
    }
    if (ln._M_string_length != uVar15) goto LAB_00109b32;
  }
  else {
    std::__cxx11::string::substr((ulong)&out,(ulong)&ln);
    std::__cxx11::string::operator=((string *)&str,(string *)&out);
    std::__cxx11::string::~string((string *)&out);
  }
  pbVar4 = pr.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar7 == 0) {
    if (1 < iVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&pr);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pr,&str);
    iVar2 = 1;
  }
  else if (iVar8 == 2) {
    if (iVar2 != 2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&in);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&in,&str);
    iVar2 = 2;
  }
  else {
    local_634 = 0;
    for (program = pr.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar3 = in.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
        input = in.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start, program != pbVar4; program = program + 1)
    {
      while (input != pbVar3) {
        std::__cxx11::stringstream::stringstream((stringstream *)&out);
        std::__cxx11::stringstream::stringstream((stringstream *)&err);
        interpreter(program,input,local_538,local_1a8);
        local_634 = local_634 + 1;
        if (iVar8 == 3) {
          std::__cxx11::stringbuf::str();
          sVar5 = local_588._M_string_length;
          std::__cxx11::string::~string((string *)&local_588);
          if (sVar5 == 0) {
            std::__cxx11::stringbuf::str();
            bVar6 = std::operator!=(&local_588,&str);
            std::__cxx11::string::~string((string *)&local_588);
            bVar18 = true;
            if (!bVar6) goto LAB_00109a16;
            poVar9 = std::operator<<((ostream *)&std::cerr,"Test failed: ");
            pcVar17 = "incorrect output";
          }
          else {
            poVar9 = std::operator<<((ostream *)&std::cerr,"Test failed: ");
            pcVar17 = "non-empty error output";
          }
LAB_001099cc:
          poVar9 = std::operator<<(poVar9,pcVar17);
          poVar9 = std::operator<<(poVar9," on test #");
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,local_634);
          poVar9 = std::operator<<(poVar9," at line ");
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,iVar13);
          std::endl<char,std::char_traits<char>>(poVar9);
          bVar18 = false;
          iVar16 = 3;
        }
        else {
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::substr((ulong)&local_588,(ulong)local_568);
          bVar6 = std::operator!=(&local_588,&str);
          std::__cxx11::string::~string((string *)&local_588);
          std::__cxx11::string::~string(local_568);
          bVar18 = true;
          if (bVar6) {
            poVar9 = std::operator<<((ostream *)&std::cerr,"Test failed: ");
            pcVar17 = "incorrect error output";
            goto LAB_001099cc;
          }
        }
LAB_00109a16:
        std::__cxx11::stringstream::~stringstream((stringstream *)&err);
        std::__cxx11::stringstream::~stringstream((stringstream *)&out);
        input = input + 1;
        if (!bVar18) goto LAB_00109abf;
      }
    }
    poVar9 = std::operator<<((ostream *)&std::cout,"Passed ");
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,local_634);
    poVar9 = std::operator<<(poVar9," test(s) on line ");
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,iVar13);
    std::endl<char,std::char_traits<char>>(poVar9);
    iVar2 = iVar8;
  }
  goto LAB_001095c0;
LAB_00109b32:
  poVar9 = std::operator<<((ostream *)&std::cerr,"Bad test file format at line ");
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,iVar13);
  std::endl<char,std::char_traits<char>>(poVar9);
LAB_00109b58:
  iVar16 = 2;
  goto LAB_00109abf;
}

Assistant:

int main(int argc, char* argv[])
{
    const char* fname = argc > 1 ? argv[1] : "tests.txt";

    std::ifstream fs;

    std::vector<std::string> pr, in;
    std::string ln, str;
    int line = 0;
#define READLN (++line, std::getline(fs, ln))
#define FMT_ASSERT(E) if(!(E)) { std::cerr << "Bad test file format at line " << line << std::endl; return 2; }
#define FAIL_TEST(MSG) std::cerr << "Test failed: " << MSG << " on test #" << ntests << " at line " << line <<std::endl; return 3

    try {
        fs.open(fname);
        if (!fs.good()) {
            std::cerr << "Couldn't open the file: " << fname << std::endl;
            return 1;
        }
        int last = 0;
        while (fs.exceptions(std::ifstream::badbit), READLN) {
            fs.exceptions(std::ifstream::failbit | std::ifstream::badbit);
            int t, blk;
            if (ln.size() >= 2 && (t = 1 + TYPES.find(ln[0])) && ((blk = ln[1] == BLOCK_O) || ln[1] == LINE_O)) {
                if (t > 2) FMT_ASSERT(pr.size() && in.size());
                if (blk) {
                    FMT_ASSERT(!~ln.find_first_not_of(BLOCK_O, 2));
                    size_t nb = ln.size() - 1;
                    bool first = true;
                    str.clear();
                    while (READLN, ln.find_first_not_of(BLOCK_C) < nb || ln.size() < nb) {
                        if (first) first = false;
                        else str.append("\n");
                        str.append(ln);
                    }
                    FMT_ASSERT(ln.size() == nb);
                } else str = ln.substr(2);
                if (t == 1) {
                    if (last > 1) pr.clear();
                    pr.push_back(str);
                } else if (t == 2) {
                    if (last != 2) in.clear();
                    in.push_back(str);
                } else {
                    int ntests = 0;
                    for (std::string &p : pr) {
                        for (std::string &i : in) {
                            ++ntests;
                            std::stringstream out, err;
                            interpreter(p, i, out, err);
                            if (t == 3) {
                                if (!err.str().empty()) {
                                    FAIL_TEST("non-empty error output");
                                }
                                if (out.str() != str) {
                                    FAIL_TEST("incorrect output");
                                }
                            } else {
                                if (err.str().substr(0, str.size()) != str) {
                                    FAIL_TEST("incorrect error output");
                                }
                            }
                        }
                    }
                    std::cout << "Passed " << ntests << " test(s) on line " << line << std::endl;
                }
                last = t;
            }
        }

    } catch (const decltype(fs)::failure& x) {
        std::cerr << "Error reading " << fname << " : " << x.what() << std::endl;
        return 1;
    }

    std::cout << "All tests succeeded\n";

    return 0;
}